

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_version(archive_read *a,archive_entry *e,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  char *p;
  char *cur_filename;
  archive_string name_utf8_string;
  archive_string version_string;
  size_t value_len;
  size_t version;
  size_t flags;
  ssize_t *extra_data_size_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  version = 0;
  value_len = 0;
  version_string.buffer_length = 0;
  flags = (size_t)extra_data_size;
  extra_data_size_local = (ssize_t *)e;
  e_local = (archive_entry *)a;
  wVar1 = read_var_sized(a,&version,&version_string.buffer_length);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    *(size_t *)flags = *(long *)flags - version_string.buffer_length;
    wVar1 = consume((archive_read *)e_local,version_string.buffer_length);
    if (wVar1 == L'\0') {
      wVar1 = read_var_sized((archive_read *)e_local,&value_len,&version_string.buffer_length);
      if (wVar1 == L'\0') {
        a_local._4_4_ = L'\x01';
      }
      else {
        *(size_t *)flags = *(long *)flags - version_string.buffer_length;
        wVar1 = consume((archive_read *)e_local,version_string.buffer_length);
        if (wVar1 == L'\0') {
          p = archive_entry_pathname_utf8((archive_entry *)extra_data_size_local);
          if (p == (char *)0x0) {
            archive_set_error((archive *)e_local,0x16,"Version entry without file name");
            a_local._4_4_ = L'\xffffffe2';
          }
          else {
            name_utf8_string.buffer_length = 0;
            version_string.s = (char *)0x0;
            version_string.length = 0;
            cur_filename = (char *)0x0;
            name_utf8_string.s = (char *)0x0;
            name_utf8_string.length = 0;
            archive_string_sprintf
                      ((archive_string *)&name_utf8_string.buffer_length,";%zu",value_len);
            archive_strcat((archive_string *)&cur_filename,p);
            archive_strcat((archive_string *)&cur_filename,(void *)name_utf8_string.buffer_length);
            archive_entry_update_pathname_utf8((archive_entry *)extra_data_size_local,cur_filename);
            archive_string_free((archive_string *)&name_utf8_string.buffer_length);
            archive_string_free((archive_string *)&cur_filename);
            a_local._4_4_ = L'\0';
          }
        }
        else {
          a_local._4_4_ = L'\x01';
        }
      }
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_version(struct archive_read* a,
    struct archive_entry* e, ssize_t* extra_data_size)
{
	size_t flags = 0;
	size_t version = 0;
	size_t value_len = 0;
	struct archive_string version_string;
	struct archive_string name_utf8_string;
	const char* cur_filename;

	/* Flags are ignored. */
	if(!read_var_sized(a, &flags, &value_len))
		return ARCHIVE_EOF;

	*extra_data_size -= value_len;
	if(ARCHIVE_OK != consume(a, value_len))
		return ARCHIVE_EOF;

	if(!read_var_sized(a, &version, &value_len))
		return ARCHIVE_EOF;

	*extra_data_size -= value_len;
	if(ARCHIVE_OK != consume(a, value_len))
		return ARCHIVE_EOF;

	/* extra_data_size should be zero here. */

	cur_filename = archive_entry_pathname_utf8(e);
	if(cur_filename == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Version entry without file name");
		return ARCHIVE_FATAL;
	}

	archive_string_init(&version_string);
	archive_string_init(&name_utf8_string);

	/* Prepare a ;123 suffix for the filename, where '123' is the version
	 * value of this file. */
	archive_string_sprintf(&version_string, ";%zu", version);

	/* Build the new filename. */
	archive_strcat(&name_utf8_string, cur_filename);
	archive_strcat(&name_utf8_string, version_string.s);

	/* Apply the new filename into this file's context. */
	archive_entry_update_pathname_utf8(e, name_utf8_string.s);

	/* Free buffers. */
	archive_string_free(&version_string);
	archive_string_free(&name_utf8_string);
	return ARCHIVE_OK;
}